

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * ossl_strerror(unsigned_long error,char *buf,size_t size)

{
  char *__src;
  size_t size_local;
  char *buf_local;
  unsigned_long error_local;
  
  if (size != 0) {
    *buf = '\0';
  }
  ERR_error_string_n(error,buf,size);
  if ((1 < size) && (*buf == '\0')) {
    __src = "No error";
    if (error != 0) {
      __src = "Unknown error";
    }
    strncpy(buf,__src,size);
    buf[size - 1] = '\0';
  }
  return buf;
}

Assistant:

static char *ossl_strerror(unsigned long error, char *buf, size_t size)
{
  if(size)
    *buf = '\0';

#ifdef OPENSSL_IS_BORINGSSL
  ERR_error_string_n((uint32_t)error, buf, size);
#else
  ERR_error_string_n(error, buf, size);
#endif

  if(size > 1 && !*buf) {
    strncpy(buf, (error ? "Unknown error" : "No error"), size);
    buf[size - 1] = '\0';
  }

  return buf;
}